

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O2

void mxx::impl::
     distribute_scatter<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out,
               size_t total_size,comm *comm)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  pair<unsigned_long,_int> pVar7;
  allocator_type local_5d;
  int root;
  int *local_58;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_sizes;
  
  local_size = (long)end._M_current - (long)begin._M_current >> 2;
  pVar7 = max_element<unsigned_long>(&local_size,comm);
  root = pVar7.second;
  bVar2 = all_same<int>(&root,comm);
  if (!bVar2) {
    assert_fail("mxx::all_same(root, comm)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                ,0x41,"distribute_scatter");
  }
  iVar3 = comm->m_size;
  uVar6 = (ulong)iVar3;
  iVar1 = comm->m_rank;
  if (iVar1 == root) {
    local_58 = out._M_current;
    if (local_size != total_size) {
      assert_fail("local_size == total_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                  ,0x46,"distribute_scatter");
      iVar3 = comm->m_size;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&send_sizes,(long)iVar3,&local_5d);
    uVar5 = 0;
    uVar4 = (ulong)(uint)comm->m_size;
    if (comm->m_size < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      send_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] =
           total_size / uVar6 + (ulong)(uVar5 < total_size % uVar6);
    }
    scatterv<int>(begin._M_current,&send_sizes,local_58,
                  total_size / uVar6 + (ulong)((ulong)(long)iVar1 < total_size % uVar6),root,comm);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&send_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  else {
    scatterv_recv<int>(out._M_current,
                       total_size / uVar6 + (ulong)((ulong)(long)iVar1 < total_size % uVar6),root,
                       comm);
  }
  return;
}

Assistant:

void distribute_scatter(_InIterator begin, _InIterator end, _OutIterator out, size_t total_size, const mxx::comm& comm) {
        size_t local_size = std::distance(begin, end);
        // get root
        std::pair<size_t, int> max_pos = mxx::max_element(local_size, comm);
        int root = max_pos.second;
        MXX_ASSERT(mxx::all_same(root, comm));
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());


        if (comm.rank() == root) {
            MXX_ASSERT(local_size == total_size);
            // use scatterv to send
            std::vector<size_t> send_sizes(comm.size());
            for (int i = 0; i < comm.size(); ++i) {
                send_sizes[i] = part.local_size(i);
            }
            // TODO: scatterv with iterators rather than pointers
            mxx::scatterv(&(*begin), send_sizes, &(*out), part.local_size(), root, comm);
        } else {
            // use scatterv to receive
            size_t recv_size = part.local_size();
            mxx::scatterv_recv(&(*out), recv_size, root, comm);
        }
    }